

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.cpp
# Opt level: O0

ostream * operator<<(ostream *os,solution *sol)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  ostream *in_RDI;
  step *s;
  const_iterator __end2;
  const_iterator __begin2;
  deque<step,_std::allocator<step>_> *__range2;
  step *in_stack_ffffffffffffff98;
  reference in_stack_ffffffffffffffa0;
  _Deque_iterator<step,_const_step_&,_const_step_*> local_38;
  long local_18;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RSI + 0x108) == 0) {
    poVar2 = std::operator<<(in_RDI,"For measuring ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(local_10 + 0x110));
    std::operator<<(poVar2," :\n");
    local_18 = local_10 + 0x68;
    std::deque<step,_std::allocator<step>_>::begin
              ((deque<step,_std::allocator<step>_> *)in_stack_ffffffffffffff98);
    std::deque<step,_std::allocator<step>_>::end
              ((deque<step,_std::allocator<step>_> *)in_stack_ffffffffffffff98);
    while( true ) {
      bVar1 = std::operator!=((_Self *)in_stack_ffffffffffffffa0,(_Self *)in_stack_ffffffffffffff98)
      ;
      if (!bVar1) break;
      in_stack_ffffffffffffffa0 =
           std::_Deque_iterator<step,_const_step_&,_const_step_*>::operator*(&local_38);
      std::operator<<(local_8,"  ");
      poVar2 = operator<<((ostream *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::operator<<(poVar2,'\n');
      std::_Deque_iterator<step,_const_step_&,_const_step_*>::operator++
                ((_Deque_iterator<step,_const_step_&,_const_step_*> *)in_stack_ffffffffffffffa0);
    }
    poVar2 = std::operator<<(local_8,"  Wasted water: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(uint *)(local_10 + 0x114));
    std::operator<<(poVar2,'\n');
  }
  else {
    poVar2 = std::operator<<(in_RDI,"No solution found for measurement ");
    std::ostream::operator<<(poVar2,*(int *)(local_10 + 0x110));
    poVar2 = std::operator<<(local_8," : ");
    std::operator<<(poVar2,*(char **)(local_10 + 0x108));
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const solution& sol)
{
	if (sol.not_found_reason) {
		os << "No solution found for measurement " << sol.measure;
		os << " : " << sol.not_found_reason;
	}
	else {
		os << "For measuring " << sol.measure << " :\n";
		for (auto&& s : sol.current_steps) {
			os << "  " << s << '\n';
		}
		os << "  Wasted water: " << sol.wastage << '\n';
	}
	return os;
}